

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O2

double __thiscall
NJamSpell::TLangModel::GetGram3Prob(TLangModel *this,TWordId word1,TWordId word2,TWordId word3)

{
  TCount TVar1;
  TCount TVar2;
  
  TVar1 = GetGram2HashCount(this,word1,word2);
  TVar2 = GetGram3HashCount(this,word1,word2,word3);
  return ((double)(~-(ulong)((double)TVar1 < (double)TVar2) & (ulong)(double)TVar2) + this->K) /
         ((double)this->TotalWords + (double)TVar1);
}

Assistant:

double TLangModel::GetGram3Prob(TWordId word1, TWordId word2, TWordId word3) const {
    double countsGram2 = GetGram2HashCount(word1, word2);
    double countsGram3 = GetGram3HashCount(word1, word2, word3);
    if (countsGram3 > countsGram2) { // hash collision
        countsGram3 = 0;
    }
    countsGram2 += TotalWords;
    countsGram3 += K;
    return countsGram3 / countsGram2;
}